

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandPrintStatus(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  Abc_Cex_t *p;
  int *piVar2;
  bool bVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Int_t *pVVar6;
  int i;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  Extra_UtilGetoptReset();
  bVar3 = true;
  while (iVar4 = Extra_UtilGetopt(argc,argv,"sh"), iVar4 == 0x73) {
    bVar3 = (bool)(bVar3 ^ 1);
  }
  if (iVar4 != -1) {
    Abc_Print(-2,"usage: print_status [-sh]\n");
    Abc_Print(-2,"\t        prints verification status\n");
    pcVar8 = "yes";
    if (!bVar3) {
      pcVar8 = "no";
    }
    Abc_Print(-2,"\t-s    : toggle using short print-out [default = %s]\n",pcVar8);
    Abc_Print(-2,"\t-h    : print the command usage\n");
    return 1;
  }
  Abc_Print(1,"Status = %d  Frames = %d   ",(ulong)(uint)pAbc->Status);
  if (pAbc->pCex == (Abc_Cex_t *)0x0) {
    if (pAbc->vCexVec == (Vec_Ptr_t *)0x0) {
      Abc_Print(1,"Cex is not defined.\n");
      goto LAB_001fc21b;
    }
  }
  else {
    Abc_CexPrintStats(pAbc->pCex);
    if (pAbc->vCexVec == (Vec_Ptr_t *)0x0) goto LAB_001fc21b;
  }
  putchar(10);
  pVVar5 = pAbc->vCexVec;
  if (0 < pVVar5->nSize) {
    lVar12 = 0;
    uVar13 = 0;
    uVar7 = 0;
    do {
      p = (Abc_Cex_t *)pVVar5->pArray[lVar12];
      if (p != (Abc_Cex_t *)0x0) {
        if (p == (Abc_Cex_t *)0x1) {
          uVar13 = (ulong)((int)uVar13 + 1);
        }
        else {
          uVar7 = (ulong)((int)uVar7 + 1);
          printf("%4d : ",uVar7);
          Abc_CexPrintStats(p);
          pVVar5 = pAbc->vCexVec;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar5->nSize);
    if ((int)uVar13 != 0) {
      printf("In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n",uVar13);
    }
  }
LAB_001fc21b:
  pVVar6 = pAbc->vStatuses;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    uVar1 = pVVar6->nSize;
    uVar13 = (ulong)uVar1;
    if (bVar3) {
      if ((int)uVar1 < 1) {
        uVar9 = 0;
        uVar10 = 0;
        uVar7 = 0;
      }
      else {
        piVar2 = pVVar6->pArray;
        uVar7 = 0;
        uVar10 = 0;
        do {
          uVar10 = (ulong)((int)uVar10 + (uint)(piVar2[uVar7] == 0));
          uVar7 = uVar7 + 1;
        } while (uVar13 != uVar7);
        uVar7 = 0;
        uVar9 = 0;
        do {
          uVar9 = (ulong)((int)uVar9 + (uint)(piVar2[uVar7] == 1));
          uVar7 = uVar7 + 1;
        } while (uVar13 != uVar7);
        uVar11 = 0;
        uVar7 = 0;
        do {
          uVar7 = (ulong)((int)uVar7 + (uint)(piVar2[uVar11] == -1));
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
      printf("Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",uVar10,
             uVar9,uVar7);
    }
    else if (0 < (int)uVar1) {
      uVar13 = 0;
      do {
        printf("%d=%d  ",uVar13 & 0xffffffff,(ulong)(uint)pVVar6->pArray[uVar13]);
        uVar13 = uVar13 + 1;
        pVVar6 = pAbc->vStatuses;
      } while ((long)uVar13 < (long)pVVar6->nSize);
    }
    putchar(10);
  }
  return 0;
}

Assistant:

int Abc_CommandPrintStatus( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fShort = 1;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "sh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fShort ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    Abc_Print( 1,"Status = %d  Frames = %d   ", pAbc->Status, pAbc->nFrames );
    if ( pAbc->pCex == NULL && pAbc->vCexVec == NULL )
        Abc_Print( 1,"Cex is not defined.\n" );
    else
    {
        if ( pAbc->pCex )
            Abc_CexPrintStats( pAbc->pCex );
        if ( pAbc->vCexVec )
        {
            Abc_Cex_t * pTemp;
            int nCexes = 0;
            int Counter = 0;
            printf( "\n" );
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                if ( pTemp == (void *)(ABC_PTRINT_T)1 )
                {
                    Counter++;
                    continue;
                }
                if ( pTemp )
                {
                    printf( "%4d : ", ++nCexes );
                    Abc_CexPrintStats( pTemp );
                }
            }
            if ( Counter )
                printf( "In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n", Counter, Vec_PtrSize(pAbc->vCexVec) );
        }
    }
    if ( pAbc->vStatuses )
    {
        if ( fShort )
        {
            printf( "Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).", 
                Vec_IntCountEntry(pAbc->vStatuses, 0), Vec_IntCountEntry(pAbc->vStatuses, 1), 
                Vec_IntCountEntry(pAbc->vStatuses, -1), Vec_IntSize(pAbc->vStatuses) );
        }
        else
        {
            int i, Entry;
            Vec_IntForEachEntry( pAbc->vStatuses, Entry, i )
                printf( "%d=%d  ", i, Entry );
        }
        printf( "\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_status [-sh]\n" );
    Abc_Print( -2, "\t        prints verification status\n" );
    Abc_Print( -2, "\t-s    : toggle using short print-out [default = %s]\n", fShort? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}